

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_mcode(compiler_state_t *cstate,char *s1,char *s2,uint masklen,qual q)

{
  bpf_u_int32 local_44;
  bpf_u_int32 local_40;
  bpf_u_int32 m;
  bpf_u_int32 n;
  int mlen;
  int nlen;
  uint masklen_local;
  char *s2_local;
  char *s1_local;
  compiler_state_t *cstate_local;
  block *pbStack_10;
  qual q_local;
  
  mlen = masklen;
  _nlen = s2;
  s2_local = s1;
  s1_local = (char *)cstate;
  cstate_local._4_4_ = q;
  n = __pcap_atoin(s1,&local_40);
  local_40 = local_40 << (0x20U - (char)n & 0x1f);
  if (_nlen == (char *)0x0) {
    if (0x20 < (uint)mlen) {
      bpf_error((compiler_state_t *)s1_local,"mask length must be <= 32");
    }
    if (mlen == 0) {
      local_44 = 0;
    }
    else {
      local_44 = -1 << (0x20U - (char)mlen & 0x1f);
    }
    if ((local_40 & (local_44 ^ 0xffffffff)) != 0) {
      bpf_error((compiler_state_t *)s1_local,"non-network bits set in \"%s/%d\"",s2_local,
                (ulong)(uint)mlen);
    }
  }
  else {
    m = __pcap_atoin(_nlen,&local_44);
    local_44 = local_44 << (0x20U - (char)m & 0x1f);
    if ((local_40 & (local_44 ^ 0xffffffff)) != 0) {
      bpf_error((compiler_state_t *)s1_local,"non-network bits set in \"%s mask %s\"",s2_local,_nlen
               );
    }
  }
  if (cstate_local._4_1_ == '\x02') {
    pbStack_10 = gen_host((compiler_state_t *)s1_local,local_40,local_44,
                          (uint)cstate_local._4_4_ >> 8 & 0xff,
                          (uint)cstate_local._4_4_ >> 0x10 & 0xff,(uint)cstate_local._4_4_ & 0xff);
  }
  else {
    bpf_error((compiler_state_t *)s1_local,"Mask syntax for networks only");
    pbStack_10 = (block *)0x0;
  }
  return pbStack_10;
}

Assistant:

struct block *
gen_mcode(compiler_state_t *cstate, const char *s1, const char *s2,
    unsigned int masklen, struct qual q)
{
	register int nlen, mlen;
	bpf_u_int32 n, m;

	nlen = __pcap_atoin(s1, &n);
	/* Promote short ipaddr */
	n <<= 32 - nlen;

	if (s2 != NULL) {
		mlen = __pcap_atoin(s2, &m);
		/* Promote short ipaddr */
		m <<= 32 - mlen;
		if ((n & ~m) != 0)
			bpf_error(cstate, "non-network bits set in \"%s mask %s\"",
			    s1, s2);
	} else {
		/* Convert mask len to mask */
		if (masklen > 32)
			bpf_error(cstate, "mask length must be <= 32");
		if (masklen == 0) {
			/*
			 * X << 32 is not guaranteed by C to be 0; it's
			 * undefined.
			 */
			m = 0;
		} else
			m = 0xffffffff << (32 - masklen);
		if ((n & ~m) != 0)
			bpf_error(cstate, "non-network bits set in \"%s/%d\"",
			    s1, masklen);
	}

	switch (q.addr) {

	case Q_NET:
		return gen_host(cstate, n, m, q.proto, q.dir, q.addr);

	default:
		bpf_error(cstate, "Mask syntax for networks only");
		/* NOTREACHED */
	}
	/* NOTREACHED */
	return NULL;
}